

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf-split.cpp
# Opt level: O2

bool __thiscall split_strategy::should_split(split_strategy *this,int i_tensor,size_t next_size)

{
  pointer *pppgVar1;
  split_mode sVar2;
  pointer __src;
  gguf_context *pgVar3;
  pointer __p;
  pointer ppgVar4;
  size_type __n;
  pointer __dest;
  void *__dest_00;
  undefined8 *puVar5;
  char *this_00;
  size_t sVar6;
  bool bVar7;
  
  sVar2 = (this->params).mode;
  if (sVar2 == MODE_TENSOR) {
    bVar7 = false;
    if ((0 < i_tensor) && (i_tensor < this->n_tensors)) {
      return i_tensor % (this->params).n_split_tensors == 0;
    }
  }
  else {
    if (sVar2 != MODE_SIZE) {
      this_00 = anon_var_dwarf_2d6;
      puVar5 = (undefined8 *)&DAT_0000011f;
      ggml_abort(anon_var_dwarf_2d6,0x11f,"invalid mode");
      __src = (((_Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_> *)this_00)->_M_impl).
              super__Vector_impl_data._M_finish;
      if (__src != (((_Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_> *)this_00)->
                   _M_impl).super__Vector_impl_data._M_end_of_storage) {
        pgVar3 = (gguf_context *)*puVar5;
        *__src = pgVar3;
        pppgVar1 = &(((_Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_> *)this_00)->
                    _M_impl).super__Vector_impl_data._M_finish;
        *pppgVar1 = *pppgVar1 + 1;
        return SUB81(pgVar3,0);
      }
      __n = std::vector<gguf_context_*,_std::allocator<gguf_context_*>_>::_M_check_len
                      ((vector<gguf_context_*,_std::allocator<gguf_context_*>_> *)this_00,1,
                       "vector::_M_realloc_insert");
      __p = (((_Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_> *)this_00)->_M_impl).
            super__Vector_impl_data._M_start;
      ppgVar4 = (((_Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_> *)this_00)->_M_impl
                ).super__Vector_impl_data._M_finish;
      sVar6 = (long)__src - (long)__p;
      __dest = std::_Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>::_M_allocate
                         ((_Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_> *)this_00,
                          __n);
      *(undefined8 *)((long)__dest + sVar6) = *puVar5;
      if (0 < (long)sVar6) {
        memmove(__dest,__p,sVar6);
      }
      __dest_00 = (void *)((long)__dest + sVar6 + 8);
      sVar6 = (long)ppgVar4 - (long)__src;
      if (0 < (long)sVar6) {
        memmove(__dest_00,__src,sVar6);
      }
      std::_Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>::_M_deallocate
                ((_Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_> *)this_00,__p,
                 (long)(((_Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_> *)this_00)->
                       _M_impl).super__Vector_impl_data._M_end_of_storage - (long)__p >> 3);
      (((_Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_> *)this_00)->_M_impl).
      super__Vector_impl_data._M_start = __dest;
      (((_Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_> *)this_00)->_M_impl).
      super__Vector_impl_data._M_finish = (pointer)((long)__dest_00 + sVar6);
      (((_Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_> *)this_00)->_M_impl).
      super__Vector_impl_data._M_end_of_storage = __dest + __n;
      return SUB81(__dest + __n,0);
    }
    bVar7 = (this->params).n_bytes_split < next_size;
  }
  return bVar7;
}

Assistant:

bool should_split(int i_tensor, size_t next_size) {
        if (params.mode == MODE_SIZE) {
            // split by max size per file
            return next_size > params.n_bytes_split;
        } else if (params.mode == MODE_TENSOR) {
            // split by number of tensors per file
            return i_tensor > 0 && i_tensor < n_tensors && i_tensor % params.n_split_tensors == 0;
        }
        // should never happen
        GGML_ABORT("invalid mode");
    }